

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O1

int read_navigation_record_values(ingest_info *info,char *line,int num_values,double *value)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  lVar8 = (long)num_values;
  uVar9 = 0;
  uVar3 = 0;
  if (0 < num_values) {
    uVar3 = (ulong)(uint)num_values;
  }
  do {
    if (uVar3 == uVar9) {
      return 0;
    }
    uVar6 = (int)uVar9 + 1U & 3;
    if (uVar6 == 0) {
      lVar4 = ftell((FILE *)info->f);
      info->offset = lVar4;
      info->linenumber = info->linenumber + 1;
      iVar2 = get_line(info->f,line);
      if (iVar2 < 0) {
        return -1;
      }
      lVar4 = 0x50;
      if (lVar8 < 4) {
        uVar1 = (uint)lVar8;
        uVar5 = uVar1 + 3;
        if (-1 < (int)uVar1) {
          uVar5 = uVar1;
        }
        lVar4 = (long)(int)((uVar1 - (uVar5 & 0xfffffffc)) * 0x13 + 4);
      }
      if (iVar2 < lVar4) {
        coda_set_error(-0x16,"record line length (%ld) too short (line: %ld, byte offset: %ld)",
                       (long)iVar2,info->linenumber,info->offset);
        return -1;
      }
    }
    uVar7 = (ulong)(uVar6 * 0x13);
    lVar4 = coda_ascii_parse_double(line + uVar7 + 4,0x13,value,0);
    value = value + 1;
    lVar8 = lVar8 + -1;
    uVar9 = uVar9 + 1;
    if (lVar4 < 0) {
      coda_add_error_message
                (" (line: %ld, byte offset: %ld)",info->linenumber,uVar7 + info->offset + 4);
      return -1;
    }
  } while( true );
}

Assistant:

static int read_navigation_record_values(ingest_info *info, char *line, int num_values, double *value)
{
    int i;

    for (i = 0; i < num_values; i++)
    {
        int index = (i + 1) % 4;

        if (index == 0)
        {
            long expected_line_length = 4 + 4 * 19;
            long linelength;

            /* read next line */
            info->offset = ftell(info->f);
            info->linenumber++;
            linelength = get_line(info->f, line);
            if (linelength < 0)
            {
                return -1;
            }
            if (num_values - i < 4)
            {
                expected_line_length = 4 + ((num_values - i) % 4) * 19;
            }
            if (linelength < expected_line_length)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "record line length (%ld) too short (line: %ld, byte offset: %ld)",
                               linelength, info->linenumber, info->offset);
                return -1;
            }
        }
        if (coda_ascii_parse_double(&line[4 + index * 19], 19, &value[i], 0) < 0)
        {
            coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset + 4 + index * 19);
            return -1;
        }
    }

    return 0;
}